

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O0

SRes LzmaDec_DecodeToBuf(CLzmaDec *p,Byte *dest,SizeT *destLen,Byte *src,SizeT *srcLen,
                        ELzmaFinishMode finishMode,ELzmaStatus *status)

{
  long lVar1;
  SRes SVar2;
  size_t __n;
  long in_RCX;
  SizeT *in_RDX;
  Byte *in_RSI;
  SizeT in_RDI;
  ELzmaStatus *in_R8;
  SRes res;
  ELzmaFinishMode curFinishMode;
  SizeT dicPos;
  SizeT outSizeCur;
  SizeT inSizeCur;
  SizeT inSize;
  SizeT outSize;
  undefined8 local_48;
  SizeT local_40;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_40 = *in_RDX;
  local_48 = *(undefined8 *)in_R8;
  *in_RDX = 0;
  in_R8[0] = LZMA_STATUS_NOT_SPECIFIED;
  in_R8[1] = LZMA_STATUS_NOT_SPECIFIED;
  while( true ) {
    if (*(long *)(in_RDI + 0x30) == *(long *)(in_RDI + 0x38)) {
      *(undefined8 *)(in_RDI + 0x30) = 0;
    }
    lVar1 = *(long *)(in_RDI + 0x30);
    SVar2 = LzmaDec_DecodeToDic((CLzmaDec *)
                                CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI
                                ,in_RSI,in_RDX,(ELzmaFinishMode)((ulong)in_RCX >> 0x20),in_R8);
    in_RCX = local_48 + in_RCX;
    *(undefined8 *)in_R8 = local_48 + *(undefined8 *)in_R8;
    __n = *(long *)(in_RDI + 0x30) - lVar1;
    memcpy(in_RSI,(void *)(*(long *)(in_RDI + 0x18) + lVar1),__n);
    in_RSI = in_RSI + __n;
    local_40 = local_40 - __n;
    *in_RDX = __n + *in_RDX;
    if (SVar2 != 0) break;
    if ((__n == 0) || (local_48 = LZMA_STATUS_NOT_SPECIFIED, local_40 == 0)) {
      return 0;
    }
  }
  return SVar2;
}

Assistant:

SRes LzmaDec_DecodeToBuf(CLzmaDec *p, Byte *dest, SizeT *destLen, const Byte *src, SizeT *srcLen, ELzmaFinishMode finishMode, ELzmaStatus *status)
{
  SizeT outSize = *destLen;
  SizeT inSize = *srcLen;
  *srcLen = *destLen = 0;
  for (;;)
  {
    SizeT inSizeCur = inSize, outSizeCur, dicPos;
    ELzmaFinishMode curFinishMode;
    SRes res;
    if (p->dicPos == p->dicBufSize)
      p->dicPos = 0;
    dicPos = p->dicPos;
    if (outSize > p->dicBufSize - dicPos)
    {
      outSizeCur = p->dicBufSize;
      curFinishMode = LZMA_FINISH_ANY;
    }
    else
    {
      outSizeCur = dicPos + outSize;
      curFinishMode = finishMode;
    }

    res = LzmaDec_DecodeToDic(p, outSizeCur, src, &inSizeCur, curFinishMode, status);
    src += inSizeCur;
    inSize -= inSizeCur;
    *srcLen += inSizeCur;
    outSizeCur = p->dicPos - dicPos;
    memcpy(dest, p->dic + dicPos, outSizeCur);
    dest += outSizeCur;
    outSize -= outSizeCur;
    *destLen += outSizeCur;
    if (res != 0)
      return res;
    if (outSizeCur == 0 || outSize == 0)
      return SZ_OK;
  }
}